

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O2

int secp256k1_der_parse_integer(secp256k1_scalar *r,uchar **sig,uchar *sigend)

{
  uchar uVar1;
  bool bVar2;
  uint uVar3;
  uchar *puVar4;
  ulong __n;
  int overflow;
  uchar ra [32];
  undefined1 auStack_38 [8];
  
  overflow = 0;
  ra[0x10] = '\0';
  ra[0x11] = '\0';
  ra[0x12] = '\0';
  ra[0x13] = '\0';
  ra[0x14] = '\0';
  ra[0x15] = '\0';
  ra[0x16] = '\0';
  ra[0x17] = '\0';
  ra[0x18] = '\0';
  ra[0x19] = '\0';
  ra[0x1a] = '\0';
  ra[0x1b] = '\0';
  ra[0x1c] = '\0';
  ra[0x1d] = '\0';
  ra[0x1e] = '\0';
  ra[0x1f] = '\0';
  ra[0] = '\0';
  ra[1] = '\0';
  ra[2] = '\0';
  ra[3] = '\0';
  ra[4] = '\0';
  ra[5] = '\0';
  ra[6] = '\0';
  ra[7] = '\0';
  ra[8] = '\0';
  ra[9] = '\0';
  ra[10] = '\0';
  ra[0xb] = '\0';
  ra[0xc] = '\0';
  ra[0xd] = '\0';
  ra[0xe] = '\0';
  ra[0xf] = '\0';
  puVar4 = *sig;
  if (puVar4 == sigend) {
    return 0;
  }
  if (*puVar4 != '\x02') {
    return 0;
  }
  *sig = puVar4 + 1;
  uVar3 = secp256k1_der_read_len(sig,sigend);
  if ((int)uVar3 < 1) {
    return 0;
  }
  puVar4 = *sig;
  if (sigend < puVar4 + uVar3) {
    return 0;
  }
  uVar1 = *puVar4;
  if (uVar3 == 1 || uVar1 != '\0') {
    if (uVar1 == 0xff && uVar3 != 1) {
      if ((char)puVar4[1] < '\0') {
        return 0;
      }
    }
    else {
      bVar2 = true;
      if (-1 < (char)uVar1) goto LAB_00116082;
    }
    overflow = 1;
    bVar2 = false;
  }
  else {
    if (-1 < (char)puVar4[1]) {
      return 0;
    }
    bVar2 = true;
  }
LAB_00116082:
  for (; 0 < (int)uVar3; uVar3 = uVar3 - 1) {
    if (*puVar4 != '\0') {
      if (uVar3 < 0x21) goto LAB_00116092;
      goto LAB_001160cd;
    }
    *sig = puVar4 + 1;
    puVar4 = puVar4 + 1;
  }
  uVar3 = 0;
LAB_00116092:
  if (bVar2) {
    __n = (ulong)uVar3;
    memcpy(auStack_38 + -__n,puVar4,__n);
    secp256k1_scalar_set_b32(r,ra,&overflow);
    if (overflow == 0) goto LAB_001160dc;
  }
LAB_001160cd:
  __n = (ulong)uVar3;
  r->d[2] = 0;
  r->d[3] = 0;
  r->d[0] = 0;
  r->d[1] = 0;
LAB_001160dc:
  *sig = *sig + __n;
  return 1;
}

Assistant:

static int secp256k1_der_parse_integer(secp256k1_scalar *r, const unsigned char **sig, const unsigned char *sigend) {
    int overflow = 0;
    unsigned char ra[32] = {0};
    int rlen;

    if (*sig == sigend || **sig != 0x02) {
        /* Not a primitive integer (X.690-0207 8.3.1). */
        return 0;
    }
    (*sig)++;
    rlen = secp256k1_der_read_len(sig, sigend);
    if (rlen <= 0 || (*sig) + rlen > sigend) {
        /* Exceeds bounds or not at least length 1 (X.690-0207 8.3.1).  */
        return 0;
    }
    if (**sig == 0x00 && rlen > 1 && (((*sig)[1]) & 0x80) == 0x00) {
        /* Excessive 0x00 padding. */
        return 0;
    }
    if (**sig == 0xFF && rlen > 1 && (((*sig)[1]) & 0x80) == 0x80) {
        /* Excessive 0xFF padding. */
        return 0;
    }
    if ((**sig & 0x80) == 0x80) {
        /* Negative. */
        overflow = 1;
    }
    while (rlen > 0 && **sig == 0) {
        /* Skip leading zero bytes */
        rlen--;
        (*sig)++;
    }
    if (rlen > 32) {
        overflow = 1;
    }
    if (!overflow) {
        memcpy(ra + 32 - rlen, *sig, rlen);
        secp256k1_scalar_set_b32(r, ra, &overflow);
    }
    if (overflow) {
        secp256k1_scalar_set_int(r, 0);
    }
    (*sig) += rlen;
    return 1;
}